

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# central.cpp
# Opt level: O0

void * __thiscall Central::malloc(Central *this,size_t __size)

{
  Span *pSVar1;
  Span *span;
  SpanMap *spanMap_local;
  Central *this_local;
  
  pSVar1 = SpanList::newSpan(&this->nonempty,(SpanMap *)__size);
  return pSVar1;
}

Assistant:

Span *Central::malloc(SpanMap *spanMap) {
    // 获取一个span, 每次获取链表头部的span
    auto span = nonempty.newSpan(spanMap);  // 如果nonempty没有span, 则调用mmap分配

    return span;

    // 让这个 span 分配一个空间, 并且设置自己的状态.
//    void *addr = span->malloc();
//    if (span->allocCount == span->nelems) {  // 已经分配满了
//        nonempty.popFront();      // pop链表头部的span
//        empty.pushFront(span);   // 将span插入到首部
//    }
//    nmalloc++;
//    return addr;
}